

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServerBase::Close(cmServerBase *this)

{
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  int in_ESI;
  int in_R8D;
  cmServerBase *this_local;
  
  if ((this->Loop).data != (void *)0x0) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->ServeThreadRunning);
    if (bVar1) {
      auto_async_t::send(&this->ShutdownSignal,in_ESI,__buf,in_RCX,in_R8D);
      uv_thread_join(&this->ServeThread);
    }
    uv_loop_close(&this->Loop);
    (this->Loop).data = (void *)0x0;
  }
  uv_loop_close(&this->Loop);
  return;
}

Assistant:

void cmServerBase::Close()
{
  if (Loop.data) {
    if (ServeThreadRunning) {
      this->ShutdownSignal.send();
      uv_thread_join(&ServeThread);
    }

    uv_loop_close(&Loop);
    Loop.data = CM_NULLPTR;
  }

  uv_loop_close(&Loop);
}